

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O0

QString * __thiscall
CPP::WriteInitialization::writeStringListProperty(WriteInitialization *this,DomStringList *list)

{
  bool bVar1;
  Language LVar2;
  qsizetype qVar3;
  const_reference value;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  qsizetype i_1;
  qsizetype i;
  qsizetype last;
  char trailingDelimiter;
  QString *propertyValue;
  QString comment;
  QStringList values;
  QTextStream str;
  undefined4 in_stack_fffffffffffffef8;
  OpenModeFlag in_stack_fffffffffffffefc;
  QList<QString> *in_stack_ffffffffffffff00;
  QString *commentHint;
  undefined4 in_stack_ffffffffffffff30;
  WriteInitialization *in_stack_ffffffffffffff38;
  QTextStream *pQVar4;
  QTextStream *pQVar5;
  long local_c0;
  char local_aa;
  _string<true> local_90 [2];
  QString local_68;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  QList<QString> local_38;
  uint local_1c;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).size = -0x5555555555555556;
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  commentHint = in_RDI;
  QString::QString((QString *)0x1380f4);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  uStack_10 = 0xaaaaaaaaaaaaaaaa;
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_ffffffffffffff00,
             in_stack_fffffffffffffefc);
  QTextStream::QTextStream((QTextStream *)&local_18,commentHint,(QFlags_conflict *)(ulong)local_1c);
  local_aa = '}';
  LVar2 = language::language();
  if (LVar2 == Cpp) {
    QTextStream::operator<<((QTextStream *)&local_18,"QStringList{");
  }
  else if (LVar2 == Python) {
    QTextStream::operator<<((QTextStream *)&local_18,'[');
    local_aa = ']';
  }
  local_38.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_38.d.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
  local_38.d.size = -0x5555555555555556;
  DomStringList::elementString
            ((DomStringList *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  bVar1 = QList<QString>::isEmpty((QList<QString> *)0x1381c8);
  if (!bVar1) {
    bVar1 = needsTranslation<DomStringList>
                      ((DomStringList *)
                       CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    if (bVar1) {
      local_50 = 0xaaaaaaaaaaaaaaaa;
      local_48 = 0xaaaaaaaaaaaaaaaa;
      local_40 = 0xaaaaaaaaaaaaaaaa;
      DomStringList::attributeComment
                ((DomStringList *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      qVar3 = QList<QString>::size(&local_38);
      for (local_c0 = 0; local_c0 <= qVar3 + -1; local_c0 = local_c0 + 1) {
        pQVar4 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_18,'\n');
        pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,(QString *)&in_RSI[1].d.size);
        pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,"    ");
        QList<QString>::at(in_stack_ffffffffffffff00,
                           CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        QString::QString((QString *)0x1382ac);
        trCall(in_stack_ffffffffffffff38,(QString *)CONCAT44(LVar2,in_stack_ffffffffffffff30),
               commentHint,in_RSI);
        QTextStream::operator<<(pQVar4,&local_68);
        QString::~QString((QString *)0x1382f2);
        QString::~QString((QString *)0x1382ff);
        if (local_c0 != qVar3 + -1) {
          QTextStream::operator<<((QTextStream *)&local_18,',');
        }
      }
      QString::~QString((QString *)0x13833f);
    }
    else {
      pQVar4 = (QTextStream *)0x0;
      while (pQVar5 = pQVar4, qVar3 = QList<QString>::size(&local_38), (long)pQVar4 < qVar3) {
        if (pQVar5 != (QTextStream *)0x0) {
          QTextStream::operator<<((QTextStream *)&local_18,", ");
        }
        value = QList<QString>::at((QList<QString> *)pQVar4,
                                   CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        language::_string<true>::_string(local_90,value,(QString *)&in_RSI[2].d.size);
        language::operator<<
                  (pQVar4,(_string<true> *)
                          CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        pQVar4 = pQVar5 + 1;
      }
    }
  }
  QTextStream::operator<<((QTextStream *)&local_18,local_aa);
  QList<QString>::~QList((QList<QString> *)0x138402);
  QTextStream::~QTextStream((QTextStream *)&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString WriteInitialization::writeStringListProperty(const DomStringList *list) const
{
    QString propertyValue;
    QTextStream str(&propertyValue);
    char trailingDelimiter = '}';
    switch (language::language()) {
     case Language::Cpp:
        str << "QStringList{";
        break;
    case Language::Python:
       str << '[';
       trailingDelimiter = ']';
       break;
    }
    const QStringList values = list->elementString();
    if (!values.isEmpty()) {
        if (needsTranslation(list)) {
            const QString comment = list->attributeComment();
            const qsizetype last = values.size() - 1;
            for (qsizetype i = 0; i <= last; ++i) {
                str << '\n' << m_indent << "    " << trCall(values.at(i), comment);
                if (i != last)
                    str << ',';
            }
        } else {
            for (qsizetype i = 0; i < values.size(); ++i) {
                if (i)
                    str << ", ";
                str << language::qstring(values.at(i), m_dindent);
            }
        }
    }
    str << trailingDelimiter;
    return propertyValue;
}